

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

void GPU_SetBlendFunction
               (GPU_Image *image,GPU_BlendFuncEnum source_color,GPU_BlendFuncEnum dest_color,
               GPU_BlendFuncEnum source_alpha,GPU_BlendFuncEnum dest_alpha)

{
  GPU_BlendFuncEnum dest_alpha_local;
  GPU_BlendFuncEnum source_alpha_local;
  GPU_BlendFuncEnum dest_color_local;
  GPU_BlendFuncEnum source_color_local;
  GPU_Image *image_local;
  
  if (image != (GPU_Image *)0x0) {
    (image->blend_mode).source_color = source_color;
    (image->blend_mode).dest_color = dest_color;
    (image->blend_mode).source_alpha = source_alpha;
    (image->blend_mode).dest_alpha = dest_alpha;
  }
  return;
}

Assistant:

void GPU_SetBlendFunction(GPU_Image* image, GPU_BlendFuncEnum source_color, GPU_BlendFuncEnum dest_color, GPU_BlendFuncEnum source_alpha, GPU_BlendFuncEnum dest_alpha)
{
    if(image == NULL)
        return;

    image->blend_mode.source_color = source_color;
    image->blend_mode.dest_color = dest_color;
    image->blend_mode.source_alpha = source_alpha;
    image->blend_mode.dest_alpha = dest_alpha;
}